

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O0

_Bool gen_branch(DisasContext_conflict12 *ctx,arg_b *a,TCGCond cond)

{
  TCGContext_conflict11 *s;
  _Bool _Var1;
  TCGLabel *l_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 source2;
  TCGv_i64 source1;
  TCGLabel *l;
  TCGContext_conflict11 *tcg_ctx;
  TCGCond cond_local;
  arg_b *a_local;
  DisasContext_conflict12 *ctx_local;
  
  s = ctx->uc->tcg_ctx;
  l_00 = gen_new_label_riscv64(s);
  t = tcg_temp_new_i64(s);
  t_00 = tcg_temp_new_i64(s);
  gen_get_gpr(s,t,a->rs1);
  gen_get_gpr(s,t_00,a->rs2);
  tcg_gen_brcond_i64_riscv64(s,cond,t,t_00,l_00);
  gen_goto_tb(ctx,1,ctx->pc_succ_insn);
  gen_set_label(s,l_00);
  _Var1 = has_ext(ctx,4);
  if ((_Var1) || (((ctx->base).pc_next + (long)a->imm & 3) == 0)) {
    gen_goto_tb(ctx,0,(ctx->base).pc_next + (long)a->imm);
  }
  else {
    gen_exception_inst_addr_mis(ctx);
  }
  (ctx->base).is_jmp = DISAS_NORETURN;
  tcg_temp_free_i64(s,t);
  tcg_temp_free_i64(s,t_00);
  return true;
}

Assistant:

static bool gen_branch(DisasContext *ctx, arg_b *a, TCGCond cond)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGLabel *l = gen_new_label(tcg_ctx);
    TCGv source1, source2;
    source1 = tcg_temp_new(tcg_ctx);
    source2 = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, source1, a->rs1);
    gen_get_gpr(tcg_ctx, source2, a->rs2);

    tcg_gen_brcond_tl(tcg_ctx, cond, source1, source2, l);
    gen_goto_tb(ctx, 1, ctx->pc_succ_insn);
    gen_set_label(tcg_ctx, l); /* branch taken */

    if (!has_ext(ctx, RVC) && ((ctx->base.pc_next + a->imm) & 0x3)) {
        /* misaligned */
        gen_exception_inst_addr_mis(ctx);
    } else {
        gen_goto_tb(ctx, 0, ctx->base.pc_next + a->imm);
    }
    ctx->base.is_jmp = DISAS_NORETURN;

    tcg_temp_free(tcg_ctx, source1);
    tcg_temp_free(tcg_ctx, source2);

    return true;
}